

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles2::Functional::RandomUniformCase::test
          (RandomUniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,
          vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,ShaderProgram *program,Random *rnd)

{
  TestLog *log;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  UniformCase *pUVar6;
  ScopedLogSection section;
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
  reportsUniform;
  allocator<char> local_d2;
  allocator<char> local_d1;
  ScopedLogSection local_d0;
  deUint32 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  string local_b8;
  string local_98;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  local_78;
  UniformCase *local_58;
  Random *local_50;
  undefined4 local_44;
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  *local_40;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *local_38;
  
  local_40 = basicUniformReportsRef;
  local_38 = basicUniforms;
  if (((this->super_UniformCase).super_CallLogWrapper.field_0x14 & 0x40) == 0) {
    bVar5 = false;
  }
  else {
    bVar5 = anon_unknown_1::UniformCollection::containsSeveralSamplerTypes
                      ((this->super_UniformCase).m_uniformCollection.m_ptr);
  }
  bVar1 = de::Random::getBool(rnd);
  bVar2 = de::Random::getBool(rnd);
  local_58 = &this->super_UniformCase;
  if (bVar2) {
    bVar3 = de::Random::getBool(rnd);
    local_bc = (undefined4)CONCAT71(extraout_var,bVar3);
  }
  else {
    local_bc = 0;
  }
  bVar3 = de::Random::getBool(rnd);
  local_50 = rnd;
  if (bVar2 && bVar3) {
    bVar4 = de::Random::getBool(rnd);
    local_c0 = (undefined4)CONCAT71(extraout_var_00,bVar4);
  }
  else {
    local_c0 = 0;
  }
  if (bVar5 == false && bVar3) {
    bVar5 = de::Random::getBool(local_50);
    local_44 = (undefined4)CONCAT71(extraout_var_01,bVar5);
  }
  else {
    local_44 = 0;
  }
  pUVar6 = local_58;
  local_c4 = (program->m_program).m_program;
  log = ((local_58->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  if ((~((byte)local_c0 | (byte)local_44 | (byte)local_bc | bVar3 | (bVar1 || bVar2)) & 1) != 0 ||
      bVar1) {
    local_78.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"InfoGetActiveUniform",&local_d2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Uniform information queries with glGetActiveUniform()",&local_d1
              );
    tcu::ScopedLogSection::ScopedLogSection(&local_d0,log,&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    bVar5 = UniformCase::getActiveUniforms
                      (pUVar6,(vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                               *)&local_78,local_40,local_c4);
    tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
    std::
    vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
    ::~vector((vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
               *)&local_78);
    if (!bVar5) {
      return false;
    }
  }
  basicUniforms_00 = local_38;
  local_78.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"GetUniformDefaults",&local_d2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Uniform default value query",&local_d1);
    tcu::ScopedLogSection::ScopedLogSection(&local_d0,log,&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    bVar5 = UniformCase::getUniforms(pUVar6,&local_78,basicUniforms_00,local_c4);
    tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
    if (!bVar5) goto LAB_00ed7536;
  }
  if ((char)local_bc != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"DefaultValueCheck",&local_d2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Verify that the uniforms have correct initial values (zeros)",
               &local_d1);
    tcu::ScopedLogSection::ScopedLogSection(&local_d0,log,&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    bVar5 = UniformCase::checkUniformDefaultValues(pUVar6,&local_78,basicUniforms_00);
    tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
    if (!bVar5) goto LAB_00ed7536;
  }
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ::~vector(&local_78);
  local_78.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"UniformAssign",&local_d2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Uniform value assignments",&local_d1);
    tcu::ScopedLogSection::ScopedLogSection(&local_d0,log,&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    UniformCase::assignUniforms(pUVar6,basicUniforms_00,local_c4,local_50);
    tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
  }
  if ((char)local_c0 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"GetUniforms",&local_d2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Uniform value query",&local_d1);
    tcu::ScopedLogSection::ScopedLogSection(&local_d0,log,&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    bVar5 = UniformCase::getUniforms(pUVar6,&local_78,basicUniforms_00,local_c4);
    tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
    pUVar6 = local_58;
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"ValueCheck",&local_d2)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Verify that the reported values match the assigned values",
                 &local_d1);
      tcu::ScopedLogSection::ScopedLogSection(&local_d0,log,&local_98,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      bVar5 = UniformCase::compareUniformValues(pUVar6,&local_78,basicUniforms_00);
      tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
      pUVar6 = local_58;
      if (bVar5) goto LAB_00ed74a1;
    }
LAB_00ed7536:
    std::
    vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
    ::~vector(&local_78);
    return false;
  }
LAB_00ed74a1:
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  ::~vector(&local_78);
  if ((char)local_44 == '\0') {
    return true;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"RenderTest",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Render test",&local_d2);
  tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_78,log,&local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  bVar5 = UniformCase::renderTest(pUVar6,basicUniforms_00,program,local_50);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_78);
  if (!bVar5) {
    return false;
  }
  return true;
}

Assistant:

bool RandomUniformCase::test (const vector<BasicUniform>& basicUniforms, const vector<BasicUniformReportRef>& basicUniformReportsRef, const ShaderProgram& program, Random& rnd)
{
	// \note Different sampler types may not be bound to same unit when rendering.
	const bool		renderingPossible						= (m_features & FEATURE_UNIFORMVALUE_ZERO) == 0 || !m_uniformCollection->containsSeveralSamplerTypes();

	bool			performGetActiveUniforms			= rnd.getBool();
	const bool		performGetUniforms					= rnd.getBool();
	const bool		performCheckUniformDefaultValues	= performGetUniforms && rnd.getBool();
	const bool		performAssignUniforms				= rnd.getBool();
	const bool		performCompareUniformValues			= performGetUniforms && performAssignUniforms && rnd.getBool();
	const bool		performRenderTest					= renderingPossible && performAssignUniforms && rnd.getBool();
	const deUint32	programGL							= program.getProgram();
	TestLog&		log									= m_testCtx.getLog();

	if (!(performGetActiveUniforms || performGetUniforms || performCheckUniformDefaultValues || performAssignUniforms || performCompareUniformValues || performRenderTest))
		performGetActiveUniforms = true; // Do something at least.

#define PERFORM_AND_CHECK(CALL, SECTION_NAME, SECTION_DESCRIPTION)						\
	do																					\
	{																					\
		const ScopedLogSection section(log, (SECTION_NAME), (SECTION_DESCRIPTION));		\
		const bool success = (CALL);													\
		if (!success)																	\
			return false;																\
	} while (false)

	if (performGetActiveUniforms)
	{
		vector<BasicUniformReportGL> reportsUniform;
		PERFORM_AND_CHECK(getActiveUniforms(reportsUniform, basicUniformReportsRef, programGL), "InfoGetActiveUniform", "Uniform information queries with glGetActiveUniform()");
	}

	{
		vector<VarValue> uniformDefaultValues;

		if (performGetUniforms)
			PERFORM_AND_CHECK(getUniforms(uniformDefaultValues, basicUniforms, programGL), "GetUniformDefaults", "Uniform default value query");
		if (performCheckUniformDefaultValues)
			PERFORM_AND_CHECK(checkUniformDefaultValues(uniformDefaultValues, basicUniforms), "DefaultValueCheck", "Verify that the uniforms have correct initial values (zeros)");
	}

	{
		vector<VarValue> uniformValues;

		if (performAssignUniforms)
		{
			const ScopedLogSection section(log, "UniformAssign", "Uniform value assignments");
			assignUniforms(basicUniforms, programGL, rnd);
		}
		if (performCompareUniformValues)
		{
			PERFORM_AND_CHECK(getUniforms(uniformValues, basicUniforms, programGL), "GetUniforms", "Uniform value query");
			PERFORM_AND_CHECK(compareUniformValues(uniformValues, basicUniforms), "ValueCheck", "Verify that the reported values match the assigned values");
		}
	}

	if (performRenderTest)
		PERFORM_AND_CHECK(renderTest(basicUniforms, program, rnd), "RenderTest", "Render test");

#undef PERFORM_AND_CHECK

	return true;
}